

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::FormulasLoader::appendNewNode(FormulasLoader *this,INode *node)

{
  pointer *pppIVar1;
  iterator __position;
  _Elt_pointer pvVar2;
  INode *local_8;
  
  if (node != (INode *)0x0) {
    pvVar2 = (this->mNodeListStack).c.
             super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_8 = node;
    if (pvVar2 == (this->mNodeListStack).c.
                  super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append
                (&this->mCurrentFormula->mMathmlAsts,&local_8);
    }
    else {
      if (pvVar2 == (this->mNodeListStack).c.
                    super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar2 = (this->mNodeListStack).c.
                 super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      __position._M_current =
           pvVar2[-1].
           super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          pvVar2[-1].super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>>::
        _M_realloc_insert<MathML::AST::INode*const&>
                  ((vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>> *)(pvVar2 + -1),
                   __position,&local_8);
      }
      else {
        *__position._M_current = node;
        pppIVar1 = &pvVar2[-1].
                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
    }
  }
  return true;
}

Assistant:

bool FormulasLoader::appendNewNode( MathML::AST::INode* node )
	{
		if ( node )
		{
			if ( mNodeListStack.empty() )
				mCurrentFormula->getMathmlAsts().append( node );
			else
				mNodeListStack.top().push_back( node );
		}
		else
		{
			// TODO error handling
		}
		return true;
	}